

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# weak_ptr.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> *this;
  ostream *poVar1;
  weak_ptr<int> local_80;
  weak_ptr<int> local_70;
  undefined4 local_5c;
  undefined1 local_58 [8];
  shared_ptr<int> shared;
  undefined1 local_28 [8];
  weak_ptr<int> weak;
  char **argv_local;
  int argc_local;
  
  weak.super___weak_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)argv;
  std::weak_ptr<int>::weak_ptr((weak_ptr<int> *)local_28);
  poVar1 = std::operator<<((ostream *)&std::cout,"weak_ptr<> not yet initialized.");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  this = &shared.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
  std::weak_ptr<int>::weak_ptr((weak_ptr<int> *)this,(weak_ptr<int> *)local_28);
  observe((weak_ptr<int> *)this);
  std::weak_ptr<int>::~weak_ptr
            ((weak_ptr<int> *)
             &shared.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  local_5c = 0x2a;
  std::make_shared<int,int>((int *)local_58);
  std::weak_ptr<int>::operator=((weak_ptr<int> *)local_28,(shared_ptr<int> *)local_58);
  poVar1 = std::operator<<((ostream *)&std::cout,"weak_ptr<> initialized with shared_ptr.");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  std::weak_ptr<int>::weak_ptr(&local_70,(weak_ptr<int> *)local_28);
  observe(&local_70);
  std::weak_ptr<int>::~weak_ptr(&local_70);
  std::shared_ptr<int>::~shared_ptr((shared_ptr<int> *)local_58);
  poVar1 = std::operator<<((ostream *)&std::cout,
                           "shared_ptr<> has been destructed due to scope exit.");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  std::weak_ptr<int>::weak_ptr(&local_80,(weak_ptr<int> *)local_28);
  observe(&local_80);
  std::weak_ptr<int>::~weak_ptr(&local_80);
  std::weak_ptr<int>::~weak_ptr((weak_ptr<int> *)local_28);
  return 0;
}

Assistant:

int main(int argc, char const *argv[])
{
	std::weak_ptr<int> weak;
	std::cout << "weak_ptr<> not yet initialized." << std::endl;
	observe(weak);

	{
		auto shared = std::make_shared<int>(42);
		weak = shared;
		std::cout << "weak_ptr<> initialized with shared_ptr." << std::endl;
		observe(weak);
	}

	std::cout << "shared_ptr<> has been destructed due to scope exit." << std::endl;
	observe(weak);

	return 0;
}